

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O2

int __thiscall
jaegertracing::samplers::RemotelyControlledSampler::close(RemotelyControlledSampler *this,int __fd)

{
  int iVar1;
  int extraout_EAX;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->_mutex);
  if (this->_running == true) {
    this->_running = false;
    std::unique_lock<std::mutex>::unlock(&uStack_18);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
    iVar1 = std::thread::join();
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void RemotelyControlledSampler::close()
{
    {
        std::unique_lock<std::mutex> lock(_mutex);
        if (!_running) {
            return;
        }
        _running = false;
        lock.unlock();
        _shutdownCV.notify_one();
    }
    _thread.join();
}